

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.h
# Opt level: O2

void __thiscall KeyStore::KeyStore(KeyStore *this)

{
  asn1::MemBuffer::MemBuffer(&this->membuf,0);
  (this->certificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->certificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->certificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->currentKeyName)._M_dataplus._M_p = (pointer)&(this->currentKeyName).field_2;
  (this->currentKeyName)._M_string_length = 0;
  (this->currentKeyName).field_2._M_local_buf[0] = '\0';
  (this->currentKeyPass)._M_dataplus._M_p = (pointer)&(this->currentKeyPass).field_2;
  (this->currentKeyPass)._M_string_length = 0;
  (this->currentKeyPass).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

KeyStore() {}